

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# behaviour_dictionary.c
# Opt level: O2

void test_bhdct_get_in_many(planck_unit_test_t *tc)

{
  undefined4 local_a0;
  undefined4 local_9c;
  undefined4 local_98;
  undefined4 local_94;
  undefined4 local_90;
  undefined4 local_8c;
  undefined4 local_88;
  undefined4 local_84;
  ion_dictionary_t dict;
  ion_dictionary_handler_t handler;
  
  bhdct_setup(tc,&handler,&dict,ion_fill_none);
  local_84 = 0x23;
  local_88 = 0x46;
  bhdct_insert(tc,&dict,&local_84,&local_88,'\x01');
  local_8c = 0x3ea;
  local_90 = 0x7d4;
  bhdct_insert(tc,&dict,&local_8c,&local_90,'\x01');
  local_94 = 0x37;
  local_98 = 0x6e;
  bhdct_insert(tc,&dict,&local_94,&local_98,'\x01');
  local_9c = 0xfffffffb;
  local_a0 = 0xfffffff6;
  bhdct_insert(tc,&dict,&local_9c,&local_a0,'\x01');
  bhdct_takedown(tc,&dict);
  return;
}

Assistant:

void
test_bhdct_get_in_many(
	planck_unit_test_t *tc
) {
	ion_dictionary_handler_t	handler;
	ion_dictionary_t			dict;

	bhdct_setup(tc, &handler, &dict, ion_fill_none);

	bhdct_insert(tc, &dict, IONIZE(35, int), IONIZE(35 * 2, int), boolean_true);
	bhdct_insert(tc, &dict, IONIZE(1002, int), IONIZE(1002 * 2, int), boolean_true);
	bhdct_insert(tc, &dict, IONIZE(55, int), IONIZE(55 * 2, int), boolean_true);
	bhdct_insert(tc, &dict, IONIZE(-5, int), IONIZE(-5 * 2, int), boolean_true);

	bhdct_takedown(tc, &dict);
}